

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

void __thiscall Fixpp::ParsingContext::setError(ParsingContext *this,Type type,char *errFmt,...)

{
  StreamBuf<char> *pSVar1;
  int iVar2;
  char local_228 [8];
  char errStr [255];
  undefined8 local_78;
  va_list args;
  size_t column;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  Type local_34 [2];
  Type type_local;
  
  pSVar1 = this->cursor->buf;
  args[0].reg_save_area = (void *)(*(long *)&pSVar1->field_0x10 - *(long *)&pSVar1->field_0x8);
  local_34[0] = type;
  memset(local_228,0,0xff);
  args[0]._0_8_ = &stack0x00000008;
  local_78 = 0x3000000018;
  args[0].overflow_arg_area = errStr + 0xf8;
  iVar2 = vsnprintf(local_228,0xff,errFmt,&local_78);
  column = (size_t)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&column,local_228,local_228 + iVar2);
  Deferred<Fixpp::ErrorKind>::construct<Fixpp::ErrorKind::Type&,unsigned_long&,std::__cxx11::string>
            (&this->error,local_34,(unsigned_long *)&args[0].reg_save_area,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&column);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)column != &local_48) {
    operator_delete((void *)column,local_48._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void setError(ErrorKind::Type type, const char* errFmt, ...)
        {
            auto column = static_cast<size_t>(cursor);

            char errStr[255];
            std::memset(errStr, 0, sizeof errStr);
            va_list args;
            va_start(args, errFmt);
            auto count = std::vsnprintf(errStr, sizeof errStr, errFmt, args);
            va_end(args);

            error.construct(type, column, std::string(errStr, count));
        }